

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# meter.cpp
# Opt level: O1

void __thiscall MeterPrivate::drawLabels(MeterPrivate *this,QPainter *painter,DrawParams *params)

{
  uint uVar1;
  uint uVar2;
  QFont *pQVar3;
  int iVar4;
  ulong uVar5;
  undefined4 extraout_XMM0_Dc;
  undefined4 extraout_XMM0_Dc_00;
  undefined4 extraout_XMM0_Dd;
  undefined4 extraout_XMM0_Dd_00;
  double extraout_XMM1_Qa;
  double dVar6;
  double extraout_XMM1_Qa_00;
  double dVar7;
  double dVar8;
  QString str;
  QFont f;
  QFontMetricsF fm;
  double local_f8;
  QString local_f0;
  double local_d8;
  QFont local_d0 [24];
  QString local_b8;
  qreal local_a0;
  QFontMetricsF local_98 [16];
  undefined1 local_88 [16];
  ulong local_70;
  undefined1 local_68 [16];
  double local_50;
  double local_48;
  undefined8 uStack_40;
  
  if ((0.0 < this->scaleGridStep) && (this->drawGridValues == true)) {
    QPainter::save();
    local_f0.d.d = (Data *)(double)this->radius;
    local_f0.d.ptr = (char16_t *)local_f0.d.d;
    QPainter::translate((QPointF *)painter);
    QPainter::setPen((QColor *)painter);
    uVar1 = this->startScaleAngle;
    local_88._0_8_ = this->maxValue;
    local_f8 = this->minValue;
    local_a0 = this->scaleGridStep;
    local_68._0_8_ = params->scaleDegree;
    pQVar3 = (QFont *)QPainter::font();
    QFont::QFont(local_d0,pQVar3);
    QFont::setPixelSize((int)local_d0);
    QPainter::setFont((QFont *)painter);
    QFontMetricsF::QFontMetricsF(local_98,local_d0);
    local_48 = ((double)local_88._0_8_ - local_f8) / local_a0;
    uStack_40 = 0;
    uVar2 = (uint)local_48;
    local_70 = (ulong)uVar2;
    if (-1 < (int)uVar2) {
      local_50 = (double)uVar1 * -0.017453292519943295;
      local_a0 = local_a0 * ((double)local_68._0_8_ / ((double)local_88._0_8_ - local_f8)) *
                 -0.017453292519943295;
      iVar4 = 0;
      do {
        dVar7 = (double)iVar4 * local_a0 + local_50;
        local_88._0_8_ = dVar7;
        dVar7 = sin(dVar7);
        local_68._8_4_ = extraout_XMM0_Dc;
        local_68._0_8_ = dVar7;
        local_68._12_4_ = extraout_XMM0_Dd;
        local_88._0_8_ = cos((double)local_88._0_8_);
        QString::number(local_f8,(char)&local_f0,0x66);
        dVar7 = (double)QFontMetricsF::size((int)local_98,(QString *)0x100,(int)&local_f0,(int *)0x0
                                           );
        dVar8 = params->margin * -3.0 + ((double)this->radius - params->gridLabelSize);
        dVar6 = (double)(int)(dVar8 * (double)local_88._0_8_ + extraout_XMM1_Qa * 0.25);
        local_b8.d.ptr._0_4_ = SUB84(dVar6,0);
        local_b8.d.d = (Data *)(double)(int)((double)local_68._0_8_ * dVar8 + dVar7 * -0.5);
        local_b8.d.ptr._4_4_ = (int)((ulong)dVar6 >> 0x20);
        QPainter::drawText((QPointF *)painter,&local_b8);
        local_f8 = local_f8 + this->scaleGridStep;
        if (&(local_f0.d.d)->super_QArrayData != (QArrayData *)0x0) {
          LOCK();
          ((local_f0.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
               ((local_f0.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if (((local_f0.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
            QArrayData::deallocate(&(local_f0.d.d)->super_QArrayData,2,8);
          }
        }
        iVar4 = iVar4 + 1;
      } while (uVar2 + 1 != iVar4);
    }
    dVar7 = local_48 - (double)(int)local_70;
    uVar5 = -(ulong)(dVar7 < -dVar7);
    if (1e-06 < (double)(~uVar5 & (ulong)dVar7 | (ulong)-dVar7 & uVar5)) {
      dVar7 = (params->startScaleAngle + params->scaleDegree) * -0.017453292519943295;
      dVar6 = sin(dVar7);
      local_88._8_4_ = extraout_XMM0_Dc_00;
      local_88._0_8_ = dVar6;
      local_88._12_4_ = extraout_XMM0_Dd_00;
      dVar6 = cos(dVar7);
      QString::number(this->maxValue,(char)&local_f0,0x66);
      dVar7 = (double)QFontMetricsF::size((int)local_98,(QString *)0x100,(int)&local_f0,(int *)0x0);
      dVar8 = params->margin * -3.0 + ((double)this->radius - params->gridLabelSize);
      dVar6 = (double)(int)(dVar8 * dVar6 + extraout_XMM1_Qa_00 * 0.25);
      local_b8.d.ptr._0_4_ = SUB84(dVar6,0);
      local_b8.d.d = (Data *)(double)(int)((double)local_88._0_8_ * dVar8 + dVar7 * -0.5);
      local_b8.d.ptr._4_4_ = (int)((ulong)dVar6 >> 0x20);
      QPainter::drawText((QPointF *)painter,&local_b8);
      if (&(local_f0.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_f0.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_f0.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if (((local_f0.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(&(local_f0.d.d)->super_QArrayData,2,8);
        }
      }
    }
    QPainter::restore();
    QFontMetricsF::~QFontMetricsF(local_98);
    QFont::~QFont(local_d0);
  }
  if ((this->unitsLabel).d.size != 0) {
    QPainter::save();
    pQVar3 = (QFont *)QPainter::font();
    QFont::QFont(local_d0,pQVar3);
    QFont::setPixelSize((int)local_d0);
    QPainter::setFont((QFont *)painter);
    QPainter::setPen((QColor *)painter);
    local_f0.d.ptr = (char16_t *)(params->margin * 3.0 + params->gridLabelSize * 3.0);
    local_f0.d.size = (qsizetype)(double)(this->radius * 2);
    local_d8 = (double)this->radius;
    local_f0.d.d = (Data *)0x0;
    QTextOption::QTextOption((QTextOption *)&local_b8,4);
    QPainter::drawText((QRectF *)painter,&local_f0,(QTextOption *)&this->unitsLabel);
    QTextOption::~QTextOption((QTextOption *)&local_b8);
    QPainter::restore();
    QFont::~QFont(local_d0);
  }
  if ((this->label).d.size != 0) {
    QPainter::save();
    pQVar3 = (QFont *)QPainter::font();
    QFont::QFont(local_d0,pQVar3);
    QFont::setPixelSize((int)local_d0);
    QPainter::setFont((QFont *)painter);
    QPainter::setPen((QColor *)painter);
    local_f0.d.size = (qsizetype)(double)(this->radius * 2);
    local_f0.d.ptr =
         (char16_t *)
         (((double)local_f0.d.size - params->margin * 3.0) - params->gridLabelSize * 3.0);
    local_d8 = (double)this->radius;
    local_f0.d.d = (Data *)0x0;
    QTextOption::QTextOption((QTextOption *)&local_b8,4);
    QPainter::drawText((QRectF *)painter,&local_f0,(QTextOption *)&this->label);
    QTextOption::~QTextOption((QTextOption *)&local_b8);
    QPainter::restore();
    QFont::~QFont(local_d0);
  }
  if (this->drawValue == true) {
    QPainter::save();
    pQVar3 = (QFont *)QPainter::font();
    QFont::QFont((QFont *)local_98,pQVar3);
    QFont::setPixelSize((int)(QFont *)local_98);
    QFont::setWeight((Weight)local_98);
    QPainter::setFont((QFont *)painter);
    QPainter::setPen((QColor *)painter);
    local_f0.d.size = (qsizetype)(double)(this->radius * 2);
    local_f0.d.ptr =
         (char16_t *)
         (((double)local_f0.d.size - params->margin) -
         (params->gridLabelSize + params->gridLabelSize));
    local_d8 = (double)this->radius;
    local_f0.d.d = (Data *)0x0;
    QString::number(this->value,(char)&local_b8,0x66);
    QTextOption::QTextOption((QTextOption *)local_d0,4);
    QPainter::drawText((QRectF *)painter,&local_f0,(QTextOption *)&local_b8);
    QTextOption::~QTextOption((QTextOption *)local_d0);
    if (&(local_b8.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_b8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_b8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_b8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_b8.d.d)->super_QArrayData,2,8);
      }
    }
    QPainter::restore();
    QFont::~QFont((QFont *)local_98);
  }
  return;
}

Assistant:

void
MeterPrivate::drawLabels( QPainter & painter, DrawParams & params )
{
	if( scaleGridStep > 0.0 && drawGridValues )
	{
		painter.save();
		painter.translate( radius, radius );
		painter.setPen( textColor );

		qreal startRad = - qDegreesToRadians( (qreal) startScaleAngle  );
		int stepsCount = ( ( maxValue - minValue ) / scaleGridStep );
		const qreal fullStepsCount = ( ( maxValue - minValue ) / scaleGridStep );
		qreal deltaRad = - qDegreesToRadians( params.scaleDegree /
			( maxValue - minValue ) * scaleGridStep );
		qreal sina, cosa;
		qreal val = minValue;

		QFont f = painter.font();
		f.setPixelSize( params.fontPixelSize );
		painter.setFont( f );
		QFontMetricsF fm( f );

		for ( int i = 0; i <= stepsCount; ++i )
		{
			sina = qSin( startRad + i * deltaRad );
			cosa = qCos( startRad + i * deltaRad );

			const QString str = QString::number( val, 'f', scalePrecision );

			const QSizeF s = fm.size( Qt::TextSingleLine, str );

			const qreal offset = ( radius - params.gridLabelSize - params.margin * 3 );

			const int x = ( offset * sina ) - ( s.width() / 2 );
			const int y = ( offset * cosa ) + ( s.height() / 4 );

			painter.drawText( x, y, str );

			val += scaleGridStep;
		}

		if( qAbs( fullStepsCount - stepsCount ) > 0.000001 )
		{
			const qreal rad = - qDegreesToRadians( params.startScaleAngle + params.scaleDegree );

			sina = qSin( rad );
			cosa = qCos( rad );

			const QString str = QString::number( maxValue, 'f', scalePrecision );

			const QSizeF s = fm.size( Qt::TextSingleLine, str );

			const qreal offset = ( radius - params.gridLabelSize - params.margin * 3 );

			const int x = ( offset * sina ) - ( s.width() / 2 );
			const int y = ( offset * cosa ) + ( s.height() / 4 );

			painter.drawText( x, y, str );
		}

		painter.restore();
	}

	if( !unitsLabel.isEmpty() )
	{
		painter.save();
		QFont f = painter.font();
		f.setPixelSize( params.fontPixelSize );
		painter.setFont( f );
		painter.setPen( textColor );
		painter.drawText( QRectF( 0, params.margin * 3 + params.gridLabelSize * 3,
			radius * 2, radius ), unitsLabel, QTextOption( Qt::AlignHCenter ) );
		painter.restore();
	}

	if( !label.isEmpty() )
	{
		painter.save();
		QFont f = painter.font();
		f.setPixelSize( params.fontPixelSize );
		painter.setFont( f );
		painter.setPen( textColor );
		painter.drawText( QRectF( 0, radius * 2 - params.margin * 3 - params.gridLabelSize * 3,
			radius * 2, radius ), label, QTextOption( Qt::AlignHCenter ) );
		painter.restore();
	}

	if( drawValue )
	{
		painter.save();
		QFont f = painter.font();
		f.setPixelSize( params.fontPixelSize * 2 );
		f.setBold( true );
		painter.setFont( f );
		painter.setPen( textColor );
		painter.drawText( QRectF( 0, radius * 2 - params.margin - params.gridLabelSize * 2,
			radius * 2, radius ), QString::number( value, 'f', valuePrecision ),
			QTextOption( Qt::AlignHCenter ) );
		painter.restore();
	}
}